

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_node *n,xpath_allocator *alloc)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  long lVar4;
  xpath_allocator *in_R8;
  xpath_node local_28;
  
  local_28._node._root = (xml_node_struct *)alloc->_root;
  if ((xpath_memory_block *)local_28._node._root == (xpath_memory_block *)0x0) {
    return;
  }
  switch((uint)this & 0xff) {
  case 1:
    if (((ulong)((xpath_memory_block *)local_28._node._root)->next & 7) != 1) {
      return;
    }
    goto LAB_00122e8b;
  case 2:
    break;
  case 3:
    if (((ulong)((xpath_memory_block *)local_28._node._root)->next & 7) != 4) {
      return;
    }
    break;
  case 4:
    if (((ulong)((xpath_memory_block *)local_28._node._root)->next & 7) != 5) {
      return;
    }
    break;
  case 5:
    if (((ulong)((xpath_memory_block *)local_28._node._root)->next & 6) != 2) {
      return;
    }
    break;
  case 6:
    if (((ulong)((xpath_memory_block *)local_28._node._root)->next & 7) != 5) {
      return;
    }
LAB_00122e8b:
    pcVar3 = "";
    if (*(char_t **)(((xpath_memory_block *)local_28._node._root)->data + 8) != (char_t *)0x0) {
      pcVar3 = *(char_t **)(((xpath_memory_block *)local_28._node._root)->data + 8);
    }
    bVar1 = strequal(pcVar3,(char_t *)ns);
    if (!bVar1) {
      return;
    }
    local_28._node._root = (xml_node_struct *)alloc->_root;
    break;
  case 7:
    if (((ulong)((xpath_memory_block *)local_28._node._root)->next & 7) != 1) {
      return;
    }
    break;
  case 8:
    if (((ulong)((xpath_memory_block *)local_28._node._root)->next & 7) != 1) {
      return;
    }
    uVar2 = (undefined1)ns->_type;
    if (uVar2 != type_unsorted) {
      pcVar3 = "";
      if (*(char **)(((xpath_memory_block *)local_28._node._root)->data + 8) != (char *)0x0) {
        pcVar3 = *(char **)(((xpath_memory_block *)local_28._node._root)->data + 8);
      }
      lVar4 = 0;
      do {
        if (pcVar3[lVar4] != uVar2) {
          return;
        }
        uVar2 = *(char *)((long)&ns->_type + lVar4 + 1);
        lVar4 = lVar4 + 1;
      } while (uVar2 != type_unsorted);
    }
    break;
  default:
    __assert_fail("!\"Unknown axis\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0x1e00,
                  "void pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, const xml_node &, xpath_allocator *)"
                 );
  }
  local_28._attribute._attr = (xml_attribute_struct *)0x0;
  xpath_node_set_raw::push_back((xpath_node_set_raw *)n,&local_28,in_R8);
  return;
}

Assistant:

PUGI__FN bool xml_node::operator!() const
	{
		return !_root;
	}